

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O2

ValueIterator __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::insert_to_bucket
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,ValueT *val,
          size_t *bucketIdx)

{
  iterator iVar1;
  pointer pvVar2;
  float fVar3;
  
  fVar3 = load_factor(this);
  pvVar2 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->mMaxLoadFactor <= fVar3 && fVar3 != this->mMaxLoadFactor) {
    rehash(this,(((long)(this->mBuckets).
                        super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) * 2);
    pvVar2 = (this->mBuckets).
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *bucketIdx = (ulong)(long)val->first %
                 (ulong)(((long)(this->mBuckets).
                                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18);
  }
  this->mSize = this->mSize + 1;
  iVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::insert
                    (pvVar2 + *bucketIdx,
                     *(pointer *)
                      ((long)&pvVar2[*bucketIdx].
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl + 8),val);
  return (ValueIterator)iVar1._M_current;
}

Assistant:

ValueIterator insert_to_bucket(const ValueT& val, size_t& bucketIdx) {
      if (load_factor() > max_load_factor()) {
        rehash(2*bucket_count());
        bucketIdx = hash_to_bucket(val.first); // bucket size change after rehash
      }
      ++mSize;
      return mBuckets[bucketIdx].insert(mBuckets[bucketIdx].end(), val);
    }